

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void io_writex(CPUArchState_conflict28 *env,CPUIOTLBEntry *iotlbentry,int mmu_idx,uint64_t val,
              target_ulong_conflict addr,uintptr_t retaddr,MemOp op)

{
  uc_struct_conflict15 *uc_00;
  MemoryRegion *mr_00;
  ulong uVar1;
  CPUState *cpu_00;
  MemoryRegionSection *pMVar2;
  MemTxResult r;
  MemoryRegion_conflict *mr;
  MemoryRegionSection *section;
  hwaddr mr_offset;
  uc_struct_conflict15 *uc;
  CPUState *cpu;
  uintptr_t retaddr_local;
  target_ulong_conflict addr_local;
  uint64_t val_local;
  int mmu_idx_local;
  CPUIOTLBEntry *iotlbentry_local;
  CPUArchState_conflict28 *env_local;
  
  cpu_00 = env_cpu(env);
  uc_00 = env->uc;
  pMVar2 = iotlb_to_section_tricore(cpu_00,iotlbentry->addr,iotlbentry->attrs);
  mr_00 = pMVar2->mr;
  uVar1 = iotlbentry->addr;
  if (cpu_00->can_do_io == 0) {
    cpu_io_recompile_tricore(cpu_00,retaddr);
  }
  cpu_00->mem_io_pc = retaddr;
  memory_region_dispatch_write_tricore
            (uc_00,(MemoryRegion_conflict *)mr_00,(uVar1 & 0xffffc000) + (ulong)addr,val,op,
             iotlbentry->attrs);
  return;
}

Assistant:

static void io_writex(CPUArchState *env, CPUIOTLBEntry *iotlbentry,
                      int mmu_idx, uint64_t val, target_ulong addr,
                      uintptr_t retaddr, MemOp op)
{
    CPUState *cpu = env_cpu(env);
    struct uc_struct *uc = env->uc;
    hwaddr mr_offset;
    MemoryRegionSection *section;
    MemoryRegion *mr;
    MemTxResult r;

    section = iotlb_to_section(cpu, iotlbentry->addr, iotlbentry->attrs);
    mr = section->mr;
    mr_offset = (iotlbentry->addr & TARGET_PAGE_MASK) + addr;
    if (!cpu->can_do_io) {
        cpu_io_recompile(cpu, retaddr);
    }
    cpu->mem_io_pc = retaddr;

    r = memory_region_dispatch_write(uc, mr, mr_offset, val, op, iotlbentry->attrs);
    if (r != MEMTX_OK) {
#if 0
        hwaddr physaddr = mr_offset +
            section->offset_within_address_space -
            section->offset_within_region;

        cpu_transaction_failed(cpu, physaddr, addr, memop_size(op),
                               MMU_DATA_STORE, mmu_idx, iotlbentry->attrs, r,
                               retaddr);
#endif
    }
}